

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateRequiredCMakeVersion
          (cmExportFileGenerator *this,ostream *os,char *versionString)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(CMAKE_VERSION VERSION_LESS ",0x1e);
  if (versionString == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,")\n  message(FATAL_ERROR \"This file relies on consumers using CMake ",0x43);
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(versionString);
    std::__ostream_insert<char,std::char_traits<char>>(os,versionString,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,")\n  message(FATAL_ERROR \"This file relies on consumers using CMake ",0x43);
    sVar1 = strlen(versionString);
    std::__ostream_insert<char,std::char_traits<char>>(os,versionString,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," or greater.\")\nendif()\n\n",0x18);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateRequiredCMakeVersion(std::ostream& os,
                                                    const char *versionString)
{
  os << "if(CMAKE_VERSION VERSION_LESS " << versionString << ")\n"
        "  message(FATAL_ERROR \"This file relies on consumers using "
        "CMake " << versionString << " or greater.\")\n"
        "endif()\n\n";
}